

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O1

Vec_Int_t * Gia_ManSimDeriveResets(Gia_Man_t *pGia)

{
  Gia_Obj_t *pGVar1;
  int *piVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  undefined8 uVar5;
  int iVar6;
  long lVar7;
  void *__s;
  Vec_Int_t *pVVar8;
  int *piVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  Gia_Obj_t *pGVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  timespec ts;
  timespec local_48;
  long local_38;
  
  iVar6 = clock_gettime(3,&local_48);
  if (iVar6 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  lVar7 = (long)pGia->nObjs;
  iVar6 = (int)(lVar7 * 2);
  iVar18 = 0x10;
  if (0xe < iVar6 - 1U) {
    iVar18 = iVar6;
  }
  local_38 = lVar7;
  if (iVar18 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar18 << 2);
  }
  iVar15 = 0;
  memset(__s,0,lVar7 << 3);
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 1000;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(4000);
  pVVar8->pArray = piVar9;
  iVar18 = pGia->nRegs;
  if (0 < iVar18) {
    do {
      iVar3 = pGia->vCos->nSize;
      uVar11 = (iVar3 - iVar18) + iVar15;
      if (((int)uVar11 < 0) || (iVar3 <= (int)uVar11)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar11 = pGia->vCos->pArray[uVar11];
      if (((long)(int)uVar11 < 0) || (pGia->nObjs <= (int)uVar11)) goto LAB_007177d4;
      pGVar4 = pGia->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar1 = pGVar4 + (int)uVar11;
      uVar21 = (uint)*(ulong *)pGVar1;
      if (uVar11 != (uVar21 & 0x1fffffff)) {
        pGVar19 = (Gia_Obj_t *)
                  ((ulong)(pGVar1 + -(ulong)(uVar21 & 0x1fffffff)) & 0xfffffffffffffffe);
        if ((pGVar19 < pGVar4) || (pGVar4 + pGia->nObjs <= pGVar19)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar18 = (int)((ulong)((long)pGVar19 - (long)pGVar4) >> 2);
        if (iVar18 * -0x55555555 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10b,"int Abc_Var2Lit(int, int)");
        }
        uVar11 = (((uint)(*(ulong *)pGVar1 >> 0x1d) ^ (uint)(pGVar1 + -(ulong)(uVar21 & 0x1fffffff))
                  ) & 1) + iVar18 * 0x55555556;
        if (iVar6 <= (int)uVar11) {
LAB_007177b5:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        piVar9 = (int *)((long)__s + (ulong)uVar11 * 4);
        *piVar9 = *piVar9 + 1;
        Gia_ManSimCollect(pGia,pGVar1 + -(ulong)((uint)*(ulong *)pGVar1 & 0x1fffffff),pVVar8);
        iVar18 = pVVar8->nSize;
        if (0 < (long)iVar18) {
          piVar9 = pVVar8->pArray;
          lVar13 = 0;
          do {
            iVar3 = piVar9[lVar13];
            if (((long)iVar3 < 0) || (iVar6 <= iVar3)) goto LAB_007177b5;
            piVar2 = (int *)((long)__s + (long)iVar3 * 4);
            *piVar2 = *piVar2 + 1;
            lVar13 = lVar13 + 1;
          } while (iVar18 != lVar13);
        }
      }
      iVar15 = iVar15 + 1;
      iVar18 = pGia->nRegs;
    } while (iVar15 < iVar18);
  }
  if (pVVar8->pArray != (int *)0x0) {
    free(pVVar8->pArray);
    pVVar8->pArray = (int *)0x0;
  }
  free(pVVar8);
  iVar18 = pGia->nObjs;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  iVar15 = 0x10;
  if (0xe < iVar18 - 1U) {
    iVar15 = iVar18;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = iVar15;
  if (iVar15 == 0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)malloc((long)iVar15 << 2);
  }
  pVVar8->pArray = piVar9;
  pVVar8->nSize = iVar18;
  memset(piVar9,0xff,(long)iVar18 << 2);
  uVar21 = 0;
  uVar22 = 0;
  uVar11 = 0;
  uVar16 = 0;
  if (0 < (int)local_38) {
    uVar10 = 1;
    if (1 < iVar6) {
      uVar10 = lVar7 * 2 & 0xffffffff;
    }
    uVar14 = 0;
    uVar11 = 0;
    uVar22 = 0;
    uVar21 = 0;
    uVar16 = 0;
    do {
      if (4 < *(int *)((long)__s + uVar14 * 4)) {
        uVar20 = uVar14 >> 1 & 0x7fffffff;
        iVar6 = (int)uVar20;
        if (pGia->nObjs <= iVar6) {
LAB_007177d4:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar4 = pGia->pObjs;
        if ((uVar14 & 1) == 0) {
          if (iVar18 <= iVar6) {
LAB_00717812:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          piVar9[uVar20] = 1;
          uVar5 = *(undefined8 *)(pGVar4 + uVar20);
          uVar17 = 0;
          if (((uint)uVar5 & 0x9fffffff) == 0x9fffffff) {
            uVar17 = (uint)((int)((uint)((ulong)uVar5 >> 0x20) & 0x1fffffff) <
                           pGia->vCis->nSize - pGia->nRegs);
          }
          uVar11 = uVar11 + uVar17;
          uVar21 = uVar21 + 1;
        }
        else {
          if (iVar18 <= iVar6) goto LAB_00717812;
          piVar9[uVar20] = 0;
          uVar5 = *(undefined8 *)(pGVar4 + uVar20);
          uVar17 = 0;
          if (((uint)uVar5 & 0x9fffffff) == 0x9fffffff) {
            uVar17 = (uint)((int)((uint)((ulong)uVar5 >> 0x20) & 0x1fffffff) <
                           pGia->vCis->nSize - pGia->nRegs);
          }
          uVar22 = uVar22 + uVar17;
          uVar16 = (ulong)((int)uVar16 + 1);
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar10 != uVar14);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  printf("Logic0 = %d (%d). Logic1 = %d (%d). ",uVar16,(ulong)uVar22,(ulong)uVar21,(ulong)uVar11);
  iVar18 = 3;
  iVar6 = clock_gettime(3,&local_48);
  if (iVar6 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  Abc_Print(iVar18,"%s =","Time");
  Abc_Print(iVar18,"%9.2f sec\n",(double)(lVar7 + lVar12) / 1000000.0);
  return pVVar8;
}

Assistant:

Vec_Int_t * Gia_ManSimDeriveResets( Gia_Man_t * pGia )
{
    int nImpLimit = 5;
    Vec_Int_t * vResult;
    Vec_Int_t * vCountLits, * vSuperGate;
    Gia_Obj_t * pObj;
    int i, k, Lit, Count;
    int Counter0 = 0, Counter1 = 0;
    int CounterPi0 = 0, CounterPi1 = 0;
    abctime clk = Abc_Clock();

    // create reset counters for each literal
    vCountLits = Vec_IntStart( 2 * Gia_ManObjNum(pGia) );

    // collect implications for each flop input driver
    vSuperGate = Vec_IntAlloc( 1000 );
    Gia_ManForEachRi( pGia, pObj, i )
    {
        if ( Gia_ObjFaninId0p(pGia, pObj) == 0 )
            continue;
        Vec_IntAddToEntry( vCountLits, Gia_ObjToLit(pGia, Gia_ObjChild0(pObj)), 1 );
        Gia_ManSimCollect( pGia, Gia_ObjFanin0(pObj), vSuperGate );
        Vec_IntForEachEntry( vSuperGate, Lit, k )
            Vec_IntAddToEntry( vCountLits, Lit, 1 );
    }
    Vec_IntFree( vSuperGate );

    // label signals whose counter if more than the limit
    vResult = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    Vec_IntForEachEntry( vCountLits, Count, Lit )
    {
        if ( Count < nImpLimit )
            continue;
        pObj = Gia_ManObj( pGia, Abc_Lit2Var(Lit) );
        if ( Abc_LitIsCompl(Lit) ) // const 0
        {
//            Ssm_ObjSetLogic0( pObj );
            Vec_IntWriteEntry( vResult, Abc_Lit2Var(Lit), 0 );
            CounterPi0 += Gia_ObjIsPi(pGia, pObj);
            Counter0++;
        }
        else
        {
//            Ssm_ObjSetLogic1( pObj );
            Vec_IntWriteEntry( vResult, Abc_Lit2Var(Lit), 1 );
            CounterPi1 += Gia_ObjIsPi(pGia, pObj);
            Counter1++;
        }
//        if ( Gia_ObjIsPi(pGia, pObj) )
//            printf( "%d ", Count );
    }
//    printf( "\n" );
    Vec_IntFree( vCountLits );

    printf( "Logic0 = %d (%d). Logic1 = %d (%d). ", Counter0, CounterPi0, Counter1, CounterPi1 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return vResult;
}